

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  long lVar1;
  Error EVar2;
  char c;
  size_t i;
  size_t len;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  len = 0;
  if (comment != (char *)0x0) {
    for (; len != 0x200; len = len + 1) {
      if (comment[len] == '\0') goto LAB_0014da4c;
    }
    len = 0x200;
  }
LAB_0014da4c:
  if (binLen < dispLen) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/logging.cpp"
               ,0x1c4,"binLen >= dispLen");
  }
  if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
    sVar5 = sb->_length;
    c = ';';
    sVar3 = sVar5;
    for (uVar4 = 0x28; lVar1 = (ulong)(binLen == 0xffffffffffffffff) * 0x1a + uVar4, lVar1 != 0x5c;
        uVar4 = uVar4 + 0x1a) {
      if ((((sVar5 < uVar4) && (EVar2 = StringBuilder::_opChars(sb,1,' ',uVar4 - sVar5), EVar2 != 0)
           ) || (EVar2 = StringBuilder::_opChar(sb,1,c), EVar2 != 0)) ||
         (EVar2 = StringBuilder::_opChar(sb,1,' '), EVar2 != 0)) {
        return EVar2;
      }
      if (lVar1 == 0x28) {
        EVar2 = StringBuilder::_opHex(sb,1,binData,binLen - (dispLen + imLen));
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
        if (EVar2 != 0) {
          return EVar2;
        }
        if (len == 0) break;
      }
      else {
        EVar2 = StringBuilder::_opString(sb,1,comment,len);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      c = '|';
      sVar5 = (sVar5 - sVar3) + sb->_length;
      sVar3 = sb->_length;
    }
  }
  EVar2 = StringBuilder::_opChar(sb,1,'\n');
  return EVar2;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}